

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O3

void __thiscall
LINAnalyzerResults::GenerateExportFile
          (LINAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulonglong *puVar4;
  size_t sVar5;
  char cVar6;
  ulong uVar7;
  ulonglong uVar8;
  U64 last_frame;
  Frame frame;
  U64 first_frame;
  ofstream file_stream;
  char number_str [128];
  char time_str [128];
  ulong local_3b8;
  ulonglong local_3a8;
  undefined8 uStack_3a0;
  ulonglong local_398;
  undefined8 uStack_390;
  undefined2 local_388;
  ulong local_378;
  ulonglong local_370;
  ulong local_368;
  ulonglong local_360;
  undefined8 uStack_358;
  ulonglong local_350;
  undefined8 uStack_348;
  undefined2 local_340;
  long local_338;
  filebuf local_330 [240];
  ios_base local_240 [264];
  char local_138 [128];
  char local_b8 [136];
  
  std::ofstream::ofstream(&local_338,file,_S_out);
  local_370 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_338,"T.BREAK,BREAK,T.SYNC,SYNC,T.PID,PID,T.D,Dn...",0x2d);
  std::ios::widen((char)(ostream *)&local_338 + (char)*(undefined8 *)(local_338 + -0x18));
  cVar6 = (char)(ostream *)&local_338;
  std::ostream::put(cVar6);
  std::ostream::flush();
  uVar3 = AnalyzerResults::GetNumFrames();
  if (uVar3 != 0) {
    uVar8 = 0;
    local_378 = uVar3;
    do {
      AnalyzerResults::GetFrame((ulonglong)&local_3a8);
      if ((char)local_388 == '\x01') {
        puVar4 = (ulonglong *)AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
        if (puVar4 != (ulonglong *)0xffffffffffffffff) {
          AnalyzerResults::GetFramesContainedInPacket((ulonglong)this,puVar4,&local_368);
          for (uVar3 = local_368; uVar3 <= local_3b8; uVar3 = uVar3 + 1) {
            AnalyzerResults::GetFrame((ulonglong)&local_360);
            local_388 = local_340;
            local_398 = local_350;
            uStack_390 = uStack_348;
            local_3a8 = local_360;
            uStack_3a0 = uStack_358;
            Frame::~Frame((Frame *)&local_360);
            uVar8 = local_398;
            cVar1 = (char)local_388;
            if ((char)local_388 != '\0') {
              AnalyzerHelpers::GetTimeString(local_3a8,local_370,uVar2,local_b8,0x80);
              uVar7 = (ulong)((uint)uVar8 & 0x3f);
              if (cVar1 != '\x03') {
                uVar7 = uVar8;
              }
              AnalyzerHelpers::GetNumberString(uVar7,display_base,8,local_138,0x80);
              sVar5 = strlen(local_b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_338,local_b8,sVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,",",1);
              sVar5 = strlen(local_138);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_338,local_138,sVar5);
              if (uVar3 < local_3b8) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,",",1);
              }
            }
          }
          std::ios::widen((char)*(undefined8 *)(local_338 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          uVar3 = local_378;
          uVar8 = local_3b8;
        }
      }
      cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar8);
      if (cVar1 != '\0') {
        std::ofstream::close();
        Frame::~Frame((Frame *)&local_3a8);
        goto LAB_00108cf3;
      }
      Frame::~Frame((Frame *)&local_3a8);
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar3);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
  std::ofstream::close();
LAB_00108cf3:
  local_338 = _VTT;
  *(undefined8 *)(local_330 + *(long *)(_VTT + -0x18) + -8) = _FrameV2;
  std::filebuf::~filebuf(local_330);
  std::ios_base::~ios_base(local_240);
  return;
}

Assistant:

void LINAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    char time_str[ 128 ];
    char number_str[ 128 ];
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "T.BREAK,BREAK,T.SYNC,SYNC,T.PID,PID,T.D,Dn..." << std::endl;

    U64 num_frames = GetNumFrames();
    for( U64 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        if( frame.mType == headerBreak )
        {
            U64 packet_id = GetPacketContainingFrameSequential( i );

            if( packet_id != INVALID_RESULT_INDEX )
            {
                U64 first_frame;
                U64 last_frame;

                GetFramesContainedInPacket( packet_id, &first_frame, &last_frame );
                // export header time
                for( U64 j = first_frame; j <= last_frame; ++j )
                {
                    frame = GetFrame( j );
                    if( frame.mType == 0 )
                        continue; // skip IBS frames.

                    U64 data = frame.mData1;
                    if( ( LINAnalyzerResults::tLINFrameState )frame.mType == LINAnalyzerResults::headerPID )
                        data = data & 0x3F; // trim the upper 2 bits from the PID frame during eport.

                    AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );
                    AnalyzerHelpers::GetNumberString( data, display_base, 8, number_str, 128 );
                    file_stream << time_str << "," << number_str;
                    if( j < last_frame )
                        file_stream << ",";
                }

                file_stream << std::endl;

                i = last_frame;
            }
        }

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            file_stream.close();
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( 0, 0 );

    file_stream.close();
}